

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

StringUtil * __thiscall cfd::core::StringUtil::ToLower(StringUtil *this,string *str)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string *str_local;
  string *value;
  
  ::std::__cxx11::string::string((string *)this,(string *)str);
  uVar1 = ::std::__cxx11::string::begin();
  uVar2 = ::std::__cxx11::string::end();
  uVar3 = ::std::__cxx11::string::begin();
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,cfd::core::StringUtil::ToLower(std::__cxx11::string_const&)::__0>
            (uVar1,uVar2,uVar3);
  return this;
}

Assistant:

std::string StringUtil::ToLower(const std::string &str) {
  static auto tolower_func = [](const char &c_value) -> char {
    return static_cast<char>(std::tolower(static_cast<char>(c_value)));
  };

  std::string value = str;
  std::transform(value.begin(), value.end(), value.begin(), tolower_func);
  return value;
}